

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rate_adaptive_code.cpp
# Opt level: O1

void __thiscall
rate_adaptive_code_from_colptr_rowIdx_equals_not_equals_operators_Test::TestBody
          (rate_adaptive_code_from_colptr_rowIdx_equals_not_equals_operators_Test *this)

{
  bool bVar1;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  RateAdaptiveCode<unsigned_short> H1;
  RateAdaptiveCode<unsigned_short> H2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_140;
  AssertHelper local_138;
  internal local_130 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  string local_120;
  RateAdaptiveCode<unsigned_short> local_100;
  RateAdaptiveCode<unsigned_short> local_88;
  
  anon_unknown.dwarf_5d66a::get_code_big_wra();
  anon_unknown.dwarf_5d66a::get_code_big_wra();
  local_130[0] = (internal)
                 LDPC4QKD::RateAdaptiveCode<unsigned_short>::operator==(&local_100,&local_88);
  local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_130[0]) {
    testing::Message::Message((Message *)&local_140);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_120,local_130,(AssertionResult *)"H1 != H2","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/XQP-Munich[P]LDPC4QKD/tests/test_rate_adaptive_code.cpp"
               ,0x138,local_120._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if (local_140._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_140._M_head_impl + 8))();
    }
  }
  if (local_128 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_128,local_128);
  }
  local_130[0] = (internal)
                 LDPC4QKD::RateAdaptiveCode<unsigned_short>::operator==(&local_100,&local_88);
  local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_130[0]) {
    testing::Message::Message((Message *)&local_140);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_120,local_130,(AssertionResult *)"H1 == H2","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/XQP-Munich[P]LDPC4QKD/tests/test_rate_adaptive_code.cpp"
               ,0x139,local_120._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if (local_140._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_140._M_head_impl + 8))();
    }
  }
  if (local_128 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_128,local_128);
  }
  LDPC4QKD::RateAdaptiveCode<unsigned_short>::recompute_pos_vn_cn(&local_100,1);
  bVar1 = LDPC4QKD::RateAdaptiveCode<unsigned_short>::operator==(&local_100,&local_88);
  local_130[0] = (internal)!bVar1;
  local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_140);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_120,local_130,(AssertionResult *)"H1 == H2","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/XQP-Munich[P]LDPC4QKD/tests/test_rate_adaptive_code.cpp"
               ,0x13b,local_120._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if (local_140._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_140._M_head_impl + 8))();
    }
  }
  if (local_128 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_128,local_128);
  }
  bVar1 = LDPC4QKD::RateAdaptiveCode<unsigned_short>::operator==(&local_100,&local_88);
  local_130[0] = (internal)!bVar1;
  local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_140);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_120,local_130,(AssertionResult *)"H1 != H2","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/XQP-Munich[P]LDPC4QKD/tests/test_rate_adaptive_code.cpp"
               ,0x13c,local_120._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if (local_140._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_140._M_head_impl + 8))();
    }
  }
  if (local_128 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_128,local_128);
  }
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector(&local_88.pos_varn);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector(&local_88.pos_checkn);
  if (local_88.rows_to_combine.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.rows_to_combine.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.rows_to_combine.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.rows_to_combine.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector(&local_88.mother_pos_varn);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector(&local_100.pos_varn);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector(&local_100.pos_checkn);
  if (local_100.rows_to_combine.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.rows_to_combine.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_100.rows_to_combine.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.rows_to_combine.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector(&local_100.mother_pos_varn);
  return;
}

Assistant:

TEST(rate_adaptive_code_from_colptr_rowIdx, equals_not_equals_operators) {
    auto H1 = get_code_big_wra();
    auto H2 = get_code_big_wra();
    EXPECT_FALSE(H1 != H2);
    EXPECT_TRUE(H1 == H2);
    H1.set_rate(1);
    EXPECT_FALSE(H1 == H2);
    EXPECT_TRUE(H1 != H2);
}